

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  double dVar1;
  reference pvVar2;
  Interval *pIVar3;
  double *pdVar4;
  int in_ESI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double> pVar5;
  qreal current;
  QGraphicsAnchorLayout *q;
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double> result;
  undefined8 in_stack_ffffffffffffff18;
  Orientation o;
  QHVContainer<std::array<double,_3UL>_> *this_00;
  array<double,_3UL> *in_stack_ffffffffffffff30;
  array<double,_3UL> *this_01;
  value_type_conflict4 maxPref;
  value_type_conflict4 pref;
  QGraphicsLayoutItem *in_stack_ffffffffffffff48;
  value_type_conflict4 minPref;
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double> *this_02;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Interval IVar6;
  qreal local_98;
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double> local_68;
  undefined1 *local_58;
  double dStack_50;
  QRectF local_48;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_ESI == 1) {
    QGraphicsLayoutItem::contentsRect(in_stack_ffffffffffffff48);
    local_98 = QRectF::width(&local_28);
  }
  else {
    QGraphicsLayoutItem::contentsRect(in_stack_ffffffffffffff48);
    local_98 = QRectF::height(&local_48);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  dStack_50 = -NAN;
  this_02 = (pair<QGraphicsAnchorLayoutPrivate::Interval,_double> *)&local_58;
  std::pair<QGraphicsAnchorLayoutPrivate::Interval,_double>::
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double,_true>(this_02);
  this_00 = &in_RDI->sizeHints;
  o = (Orientation)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  QHVContainer<std::array<double,_3UL>_>::operator[](this_00,o);
  pvVar2 = std::array<double,_3UL>::operator[](in_stack_ffffffffffffff30,(size_type)local_98);
  this_01 = (array<double,_3UL> *)*pvVar2;
  QHVContainer<std::array<double,_3UL>_>::operator[](this_00,o);
  pvVar2 = std::array<double,_3UL>::operator[](this_01,(size_type)local_98);
  maxPref = *pvVar2;
  QHVContainer<std::array<double,_3UL>_>::operator[](this_00,0);
  pvVar2 = std::array<double,_3UL>::operator[](this_01,(size_type)local_98);
  pref = *pvVar2;
  QHVContainer<std::array<double,_3UL>_>::operator[](this_00,0);
  pvVar2 = std::array<double,_3UL>::operator[](this_01,(size_type)local_98);
  minPref = *pvVar2;
  QHVContainer<std::array<double,_3UL>_>::operator[](this_00,0);
  std::array<double,_3UL>::operator[](this_01,(size_type)local_98);
  pVar5 = getFactor((qreal)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    (qreal)this_02,minPref,pref,maxPref,(qreal)this_01);
  local_68.first = pVar5.first;
  local_68.second = pVar5.second;
  std::pair<QGraphicsAnchorLayoutPrivate::Interval,_double>::operator=(this_02,&local_68);
  IVar6 = (Interval)local_58;
  pIVar3 = QHVContainer<QGraphicsAnchorLayoutPrivate::Interval>::operator[]
                     ((QHVContainer<QGraphicsAnchorLayoutPrivate::Interval> *)this_00,0);
  dVar1 = dStack_50;
  *pIVar3 = IVar6;
  pdVar4 = QHVContainer<double>::operator[]((QHVContainer<double> *)this_00,0);
  *pdVar4 = dVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation(
    Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);

    qreal current;
    current = (orientation == Qt::Horizontal) ? q->contentsRect().width() : q->contentsRect().height();

    std::pair<Interval, qreal> result;
    result = getFactor(current,
                       sizeHints[orientation][Qt::MinimumSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::MaximumSize]);

    interpolationInterval[orientation] = result.first;
    interpolationProgress[orientation] = result.second;
}